

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

void __thiscall
cs_impl::runtime_cs_ext::fiber_callable::fiber_callable
          (fiber_callable *this,function *fn,vector *data,array *append_args)

{
  context_t *pcVar1;
  iterator __last;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RCX;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  function *in_RSI;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDI;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>
  *in_stack_ffffffffffffffd8;
  const_iterator __position;
  
  __position._M_current = (any *)in_RDX;
  pcVar1 = cs::function::get_context(in_RSI);
  (in_RDI->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)pcVar1;
  (in_RDI->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
  super__Deque_impl_data._M_map_size = (size_t)in_RSI;
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
            (in_RDX,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_RDI);
  __last = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::end
                     ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_RDI);
  __gnu_cxx::
  __normal_iterator<cs_impl::any_const*,std::vector<cs_impl::any,std::allocator<cs_impl::any>>>::
  __normal_iterator<cs_impl::any*>
            ((__normal_iterator<const_cs_impl::any_*,_std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_>
              *)in_RDX,
             (__normal_iterator<cs_impl::any_*,_std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_>
              *)in_RDI);
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::begin(in_RDI);
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::end(in_RDI);
  std::vector<cs_impl::any,std::allocator<cs_impl::any>>::
  insert<std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>,void>
            (in_RCX,__position,in_stack_ffffffffffffffd8,
             (_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> *)
             __last._M_current);
  return;
}

Assistant:

fiber_callable(function const *fn, vector data, const array &append_args) : context(fn->get_context()), func(fn), args(std::move(data))
			{
				args.insert(args.end(), append_args.begin(), append_args.end());
			}